

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day06a.cpp
# Opt level: O1

void day6a::run(void)

{
  ostream *poVar1;
  string input;
  char local_49;
  string local_48;
  string local_28;
  
  read_file_abi_cxx11_(&local_28,"input/day6.txt");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"day6a ",6);
  recover_message(&local_48,&local_28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_48._M_dataplus._M_p,local_48._M_string_length);
  local_49 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void run() {
		std::string input = read_file("input/day6.txt");
		std::cout << "day6a ";
		std::cout << recover_message(input) << '\n';
		//std::cout << recover_message("eedadn\ndrvtee\neandsr\nraavrd\n"
		//	"atevrs\ntsrnev\nsdttsa\nrasrtv\n"
		//	"nssdts\nntnada\nsvetve\ntesnvt\n"
		//	"vntsnd\nvrdear\ndvrsen\nenarar") << '\n';
	}